

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvram.cpp
# Opt level: O1

CBString * phoenixFlashMapGuidToUString(CBString *__return_storage_ptr__,EFI_GUID *guid)

{
  int iVar1;
  char *s;
  UByteArray baGuid;
  undefined1 *local_40;
  size_t local_38;
  undefined1 local_30 [16];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,guid,guid + 1);
  if (local_38 == NVRAM_PHOENIX_FLASH_MAP_VOLUME_HEADER.d._M_string_length) {
    s = "Volume header";
    if (local_38 != 0) {
      iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_VOLUME_HEADER.d._M_dataplus._M_p,local_38);
      if (iVar1 != 0) goto LAB_001104e3;
    }
  }
  else {
LAB_001104e3:
    if (local_38 == NVRAM_PHOENIX_FLASH_MAP_MICROCODES_GUID.d._M_string_length) {
      s = "Microcodes";
      if (local_38 != 0) {
        iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_MICROCODES_GUID.d._M_dataplus._M_p,local_38);
        if (iVar1 != 0) goto LAB_00110518;
      }
    }
    else {
LAB_00110518:
      if (local_38 == NVRAM_PHOENIX_FLASH_MAP_CMDB_GUID.d._M_string_length) {
        s = "CMDB";
        if (local_38 != 0) {
          iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_CMDB_GUID.d._M_dataplus._M_p,local_38);
          if (iVar1 != 0) goto LAB_0011054d;
        }
      }
      else {
LAB_0011054d:
        if (local_38 == NVRAM_PHOENIX_FLASH_MAP_PUBKEY1_GUID.d._M_string_length) {
          s = "SLIC pubkey";
          if (local_38 != 0) {
            iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_PUBKEY1_GUID.d._M_dataplus._M_p,local_38);
            if (iVar1 != 0) goto LAB_00110582;
          }
        }
        else {
LAB_00110582:
          if (local_38 == NVRAM_PHOENIX_FLASH_MAP_PUBKEY2_GUID.d._M_string_length) {
            s = "SLIC pubkey";
            if (local_38 != 0) {
              iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_PUBKEY2_GUID.d._M_dataplus._M_p,local_38
                          );
              if (iVar1 != 0) goto LAB_001105b7;
            }
          }
          else {
LAB_001105b7:
            if (local_38 == NVRAM_PHOENIX_FLASH_MAP_MARKER1_GUID.d._M_string_length) {
              s = "SLIC marker";
              if (local_38 != 0) {
                iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_MARKER1_GUID.d._M_dataplus._M_p,
                             local_38);
                if (iVar1 != 0) goto LAB_001105ec;
              }
            }
            else {
LAB_001105ec:
              if (local_38 == NVRAM_PHOENIX_FLASH_MAP_MARKER2_GUID.d._M_string_length) {
                s = "SLIC marker";
                if (local_38 != 0) {
                  iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_MARKER2_GUID.d._M_dataplus._M_p,
                               local_38);
                  if (iVar1 != 0) goto LAB_00110621;
                }
              }
              else {
LAB_00110621:
                if (local_38 == NVRAM_PHOENIX_FLASH_MAP_EVSA1_GUID.d._M_string_length) {
                  s = "EVSA store";
                  if (local_38 != 0) {
                    iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_EVSA1_GUID.d._M_dataplus._M_p,
                                 local_38);
                    if (iVar1 != 0) goto LAB_00110656;
                  }
                }
                else {
LAB_00110656:
                  if (local_38 == NVRAM_PHOENIX_FLASH_MAP_EVSA2_GUID.d._M_string_length) {
                    s = "EVSA store";
                    if (local_38 != 0) {
                      iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_EVSA2_GUID.d._M_dataplus._M_p,
                                   local_38);
                      if (iVar1 != 0) goto LAB_0011068b;
                    }
                  }
                  else {
LAB_0011068b:
                    if (local_38 == NVRAM_PHOENIX_FLASH_MAP_EVSA3_GUID.d._M_string_length) {
                      s = "EVSA store";
                      if (local_38 != 0) {
                        iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_EVSA3_GUID.d._M_dataplus._M_p,
                                     local_38);
                        if (iVar1 != 0) goto LAB_001106c0;
                      }
                    }
                    else {
LAB_001106c0:
                      if (local_38 == NVRAM_PHOENIX_FLASH_MAP_EVSA4_GUID.d._M_string_length) {
                        s = "EVSA store";
                        if (local_38 != 0) {
                          iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_EVSA4_GUID.d._M_dataplus.
                                                _M_p,local_38);
                          if (iVar1 != 0) goto LAB_001106f5;
                        }
                      }
                      else {
LAB_001106f5:
                        if (local_38 == NVRAM_PHOENIX_FLASH_MAP_EVSA5_GUID.d._M_string_length) {
                          s = "EVSA store";
                          if (local_38 != 0) {
                            iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_EVSA5_GUID.d._M_dataplus.
                                                  _M_p,local_38);
                            if (iVar1 != 0) goto LAB_0011072a;
                          }
                        }
                        else {
LAB_0011072a:
                          if (local_38 == NVRAM_PHOENIX_FLASH_MAP_EVSA6_GUID.d._M_string_length) {
                            s = "EVSA store";
                            if (local_38 != 0) {
                              iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_EVSA6_GUID.d._M_dataplus
                                                    ._M_p,local_38);
                              if (iVar1 != 0) goto LAB_0011075f;
                            }
                          }
                          else {
LAB_0011075f:
                            if (local_38 == NVRAM_PHOENIX_FLASH_MAP_EVSA7_GUID.d._M_string_length) {
                              s = "EVSA store";
                              if (local_38 != 0) {
                                iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_EVSA7_GUID.d.
                                                      _M_dataplus._M_p,local_38);
                                if (iVar1 != 0) goto LAB_0011078c;
                              }
                            }
                            else {
LAB_0011078c:
                              if (local_38 == NVRAM_PHOENIX_FLASH_MAP_SELF_GUID.d._M_string_length)
                              {
                                s = "Flash map";
                                if (local_38 != 0) {
                                  iVar1 = bcmp(local_40,NVRAM_PHOENIX_FLASH_MAP_SELF_GUID.d.
                                                        _M_dataplus._M_p,local_38);
                                  if (iVar1 != 0) goto LAB_001107b9;
                                }
                              }
                              else {
LAB_001107b9:
                                s = "Unknown";
                                if (local_38 == ZERO_GUID.d._M_string_length) {
                                  if (local_38 != 0) {
                                    iVar1 = bcmp(local_40,ZERO_GUID.d._M_dataplus._M_p,local_38);
                                    if (iVar1 != 0) goto LAB_001107e6;
                                  }
                                  Bstrlib::CBString::CBString(__return_storage_ptr__);
                                  goto LAB_001107f1;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_001107e6:
  Bstrlib::CBString::CBString(__return_storage_ptr__,s);
LAB_001107f1:
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

UString phoenixFlashMapGuidToUString(const EFI_GUID & guid)
{
    const UByteArray baGuid((const char*)&guid, sizeof(EFI_GUID));
    if (baGuid == NVRAM_PHOENIX_FLASH_MAP_VOLUME_HEADER)        return UString("Volume header");
    if (baGuid == NVRAM_PHOENIX_FLASH_MAP_MICROCODES_GUID)      return UString("Microcodes");
    if (baGuid == NVRAM_PHOENIX_FLASH_MAP_CMDB_GUID)            return UString("CMDB");
    if (baGuid == NVRAM_PHOENIX_FLASH_MAP_PUBKEY1_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_PUBKEY2_GUID)      return UString("SLIC pubkey");
    if (baGuid == NVRAM_PHOENIX_FLASH_MAP_MARKER1_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_MARKER2_GUID)      return UString("SLIC marker");
    if (baGuid == NVRAM_PHOENIX_FLASH_MAP_EVSA1_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_EVSA2_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_EVSA3_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_EVSA4_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_EVSA5_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_EVSA6_GUID
        || baGuid == NVRAM_PHOENIX_FLASH_MAP_EVSA7_GUID)        return UString("EVSA store");
    if (baGuid == NVRAM_PHOENIX_FLASH_MAP_SELF_GUID)            return UString("Flash map");
    if (baGuid == ZERO_GUID)                                    return UString();
    return UString("Unknown");
}